

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void * resizebox(lua_State *L,int idx,size_t newsize)

{
  void *in_RAX;
  undefined8 *puVar1;
  lua_Alloc p_Var2;
  void *pvVar3;
  void *ud;
  void *local_28;
  
  local_28 = in_RAX;
  puVar1 = (undefined8 *)lua_touserdata(L,idx);
  if (puVar1[1] == newsize) {
    pvVar3 = (void *)*puVar1;
  }
  else {
    p_Var2 = lua_getallocf(L,&local_28);
    pvVar3 = (*p_Var2)(local_28,(void *)*puVar1,puVar1[1],newsize);
    if ((newsize != 0) && (pvVar3 == (void *)0x0)) {
      resizebox_cold_1();
    }
    *puVar1 = pvVar3;
    puVar1[1] = newsize;
  }
  return pvVar3;
}

Assistant:

static void *resizebox (lua_State *L, int idx, size_t newsize) {
  UBox *box = (UBox *)lua_touserdata(L, idx);
  if (box->bsize == newsize)  /* not changing size? */
    return box->box;  /* keep the buffer */
  else {
    void *ud;
    lua_Alloc allocf = lua_getallocf(L, &ud);
    void *temp = allocf(ud, box->box, box->bsize, newsize);
    if (l_unlikely(temp == NULL && newsize > 0)) {  /* allocation error? */
      lua_pushliteral(L, "not enough memory");
      lua_error(L);  /* raise a memory error */
    }
    box->box = temp;
    box->bsize = newsize;
    return temp;
  }
}